

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O2

ASN1_STRING * bn_to_asn1_string(BIGNUM *bn,ASN1_STRING *ai,int type)

{
  int iVar1;
  uint len;
  ASN1_STRING *str;
  
  str = ai;
  if ((ai == (ASN1_STRING *)0x0) &&
     (str = (ASN1_STRING *)ASN1_STRING_type_new(type), str == (ASN1_STRING *)0x0)) {
    str = (ASN1_STRING *)0x0;
    ERR_put_error(0xc,0,0x9e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x182);
  }
  else {
    iVar1 = BN_is_negative(bn);
    if (iVar1 != 0) {
      iVar1 = BN_is_zero(bn);
      if (iVar1 == 0) {
        type = type | 0x100;
      }
    }
    ((ASN1_STRING *)str)->type = type;
    len = BN_num_bytes(bn);
    iVar1 = ASN1_STRING_set((ASN1_STRING *)str,(void *)0x0,len);
    if ((iVar1 != 0) &&
       (iVar1 = BN_bn2bin_padded(((ASN1_STRING *)str)->data,(long)(int)len,bn), iVar1 != 0)) {
      return str;
    }
  }
  if (str != ai) {
    ASN1_STRING_free((ASN1_STRING *)str);
  }
  return (ASN1_STRING *)0x0;
}

Assistant:

static ASN1_STRING *bn_to_asn1_string(const BIGNUM *bn, ASN1_STRING *ai,
                                      int type) {
  ASN1_INTEGER *ret;
  if (ai == NULL) {
    ret = ASN1_STRING_type_new(type);
  } else {
    ret = ai;
  }
  int len;
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
    goto err;
  }

  if (BN_is_negative(bn) && !BN_is_zero(bn)) {
    ret->type = type | V_ASN1_NEG;
  } else {
    ret->type = type;
  }

  len = BN_num_bytes(bn);
  if (!ASN1_STRING_set(ret, NULL, len) ||
      !BN_bn2bin_padded(ret->data, len, bn)) {
    goto err;
  }
  return ret;

err:
  if (ret != ai) {
    ASN1_STRING_free(ret);
  }
  return NULL;
}